

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharMap.h
# Opt level: O2

unsigned_long __thiscall
UnifiedRegex::CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1>::Get
          (CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1> *this,Char kc)

{
  bool bVar1;
  BOOL BVar2;
  unsigned_long uVar3;
  Type *pTVar4;
  undefined6 in_register_00000032;
  uint k;
  Type local_28;
  unsigned_long lastOcc;
  
  k = (uint)CONCAT62(in_register_00000032,kc);
  if ((ushort)kc < 0x100) {
    BVar2 = IsInDirectMap(this,k);
    if (BVar2 != 0) {
      uVar3 = GetDirectMap(this,k);
      return uVar3;
    }
    uVar3 = this->defv;
  }
  else {
    bVar1 = GetNonDirect(this,k,&local_28);
    pTVar4 = &this->defv;
    if (bVar1) {
      pTVar4 = &local_28;
    }
    uVar3 = *pTVar4;
  }
  return uVar3;
}

Assistant:

inline V Get(Char kc) const
        {
            if (CTU(kc) < GetDirectMapSize())
            {
                if (!IsInDirectMap(CTU(kc)))
                {
                    return defv;
                }
                return GetDirectMap(CTU(kc));
            }
            else
            {
                V lastOcc;
                if (!GetNonDirect(CTU(kc), lastOcc))
                {
                    return defv;
                }
                return lastOcc;
            }
        }